

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O3

LogSample __thiscall
MT32Emu::LA32WaveGenerator::getOutputLogSample(LA32WaveGenerator *this,bool first)

{
  LogSample LVar1;
  
  LVar1.logValue = 0xffff;
  LVar1._2_2_ = 0;
  LVar1.sign = POSITIVE;
  if (this->active == true) {
    LVar1 = *(LogSample *)
             ((long)&(this->squareLogSample).logValue +
             (ulong)((uint)(this->pcmWaveAddress != (Bit16s *)0x0) * 0x10 + (uint)!first * 8));
  }
  return LVar1;
}

Assistant:

LogSample LA32WaveGenerator::getOutputLogSample(const bool first) const {
	if (!isActive()) {
		return SILENCE;
	}
	if (isPCMWave()) {
		return first ? firstPCMLogSample : secondPCMLogSample;
	}
	return first ? squareLogSample : resonanceLogSample;
}